

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

uint __thiscall crnlib::symbol_codec::decode(symbol_codec *this,adaptive_huffman_data_model *model)

{
  ushort uVar1;
  decoder_tables *pdVar2;
  byte *pbVar3;
  uint uVar4;
  uint uVar5;
  unsigned_short *puVar6;
  uint freq;
  int val_ptr;
  uint32 t;
  uint len;
  uint sym;
  uint k;
  uint c;
  decoder_tables *pTables;
  adaptive_huffman_data_model *model_local;
  symbol_codec *this_local;
  
  pdVar2 = model->m_pDecode_tables;
  while (this->m_bit_count < 0x18) {
    sym = 0;
    if (this->m_pDecode_buf_next == this->m_pDecode_buf_end) {
      if ((this->m_decode_buf_eof & 1U) == 0) {
        (*this->m_pDecode_need_bytes_func)
                  ((long)this->m_pDecode_buf_next - (long)this->m_pDecode_buf,
                   this->m_pDecode_private_data,&this->m_pDecode_buf,&this->m_decode_buf_size,
                   &this->m_decode_buf_eof);
        this->m_pDecode_buf_end = this->m_pDecode_buf + this->m_decode_buf_size;
        this->m_pDecode_buf_next = this->m_pDecode_buf;
        if (this->m_pDecode_buf_next < this->m_pDecode_buf_end) {
          pbVar3 = this->m_pDecode_buf_next;
          this->m_pDecode_buf_next = pbVar3 + 1;
          sym = (uint)*pbVar3;
        }
      }
    }
    else {
      pbVar3 = this->m_pDecode_buf_next;
      this->m_pDecode_buf_next = pbVar3 + 1;
      sym = (uint)*pbVar3;
    }
    this->m_bit_count = this->m_bit_count + 8;
    this->m_bit_buf = sym << (0x20U - (char)this->m_bit_count & 0x1f) | this->m_bit_buf;
  }
  uVar4 = (this->m_bit_buf >> 0x10) + 1;
  if (pdVar2->m_table_max_code < uVar4) {
    val_ptr = pdVar2->m_decode_start_code_size;
    while (pdVar2->m_max_codes[val_ptr - 1] < uVar4) {
      val_ptr = val_ptr + 1;
    }
    uVar4 = pdVar2->m_val_ptrs[val_ptr - 1] + (this->m_bit_buf >> (0x20U - (char)val_ptr & 0x1f));
    if (model->m_total_syms <= uVar4) {
      return 0;
    }
    t = (uint32)pdVar2->m_sorted_symbol_order[(int)uVar4];
  }
  else {
    t = pdVar2->m_lookup[this->m_bit_buf >> (0x20U - (char)pdVar2->m_table_bits & 0x1f)] & 0xffff;
    val_ptr = pdVar2->m_lookup[this->m_bit_buf >> (0x20U - (char)pdVar2->m_table_bits & 0x1f)] >>
              0x10;
  }
  this->m_bit_buf = this->m_bit_buf << ((byte)val_ptr & 0x1f);
  this->m_bit_count = this->m_bit_count - val_ptr;
  puVar6 = vector<unsigned_short>::operator[](&model->m_sym_freq,t);
  uVar1 = *puVar6;
  puVar6 = vector<unsigned_short>::operator[](&model->m_sym_freq,t);
  *puVar6 = (unsigned_short)(uVar1 + 1);
  if (uVar1 + 1 == 0xffff) {
    adaptive_huffman_data_model::rescale(model);
  }
  uVar5 = model->m_symbols_until_update - 1;
  model->m_symbols_until_update = uVar5;
  if (uVar5 == 0) {
    this->m_total_model_updates = this->m_total_model_updates + 1;
    adaptive_huffman_data_model::update(model);
  }
  return t;
}

Assistant:

uint symbol_codec::decode(adaptive_huffman_data_model& model)
    {
        CRNLIB_ASSERT(m_mode == cDecoding);
        CRNLIB_ASSERT(!model.m_encoding);

        const prefix_coding::decoder_tables* pTables = model.m_pDecode_tables;

        while (m_bit_count < (cBitBufSize - 8))
        {
            uint c = 0;
            if (m_pDecode_buf_next == m_pDecode_buf_end)
            {
                if (!m_decode_buf_eof)
                {
                    m_pDecode_need_bytes_func(m_pDecode_buf_next - m_pDecode_buf, m_pDecode_private_data, m_pDecode_buf, m_decode_buf_size, m_decode_buf_eof);
                    m_pDecode_buf_end = m_pDecode_buf + m_decode_buf_size;
                    m_pDecode_buf_next = m_pDecode_buf;
                    if (m_pDecode_buf_next < m_pDecode_buf_end)
                    {
                        c = *m_pDecode_buf_next++;
                    }
                }
            }
            else
            {
                c = *m_pDecode_buf_next++;
            }

            m_bit_count += 8;
            m_bit_buf |= (static_cast<bit_buf_t>(c) << (cBitBufSize - m_bit_count));
        }

        uint k = static_cast<uint>((m_bit_buf >> (cBitBufSize - 16)) + 1);
        uint sym, len;

        if (k <= pTables->m_table_max_code)
        {
            uint32 t = pTables->m_lookup[m_bit_buf >> (cBitBufSize - pTables->m_table_bits)];

            CRNLIB_ASSERT(t != cUINT32_MAX);
            sym = t & cUINT16_MAX;
            len = t >> 16;

            CRNLIB_ASSERT(model.m_code_sizes[sym] == len);
        }
        else
        {
            len = pTables->m_decode_start_code_size;

            for (;;)
            {
                if (k <= pTables->m_max_codes[len - 1])
                {
                    break;
                }
                len++;
            }

            int val_ptr = pTables->m_val_ptrs[len - 1] + static_cast<int>((m_bit_buf >> (cBitBufSize - len)));

            if (((uint)val_ptr >= model.m_total_syms))
            {
                // corrupted stream, or a bug
                CRNLIB_ASSERT(0);
                return 0;
            }

            sym = pTables->m_sorted_symbol_order[val_ptr];
        }

        m_bit_buf <<= len;
        m_bit_count -= len;

        uint freq = model.m_sym_freq[sym];
        freq++;
        model.m_sym_freq[sym] = static_cast<uint16>(freq);

        if (freq == cUINT16_MAX)
        {
            model.rescale();
        }

        if (--model.m_symbols_until_update == 0)
        {
            m_total_model_updates++;
            model.update();
        }

        return sym;
    }